

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void test(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  ostream *this;
  long in_RSI;
  int in_EDI;
  ifstream ifs;
  string infile;
  FastText fasttext;
  int32_t k;
  char *in_stack_fffffffffffffce8;
  FastText *in_stack_fffffffffffffcf0;
  undefined1 local_2e0 [260];
  int32_t in_stack_fffffffffffffe24;
  istream *in_stack_fffffffffffffe28;
  FastText *in_stack_fffffffffffffe30;
  string *in_stack_ffffffffffffff18;
  FastText *in_stack_ffffffffffffff20;
  allocator local_d1;
  string local_d0 [55];
  allocator local_99;
  string local_98 [132];
  int local_14;
  long local_10;
  
  local_10 = in_RSI;
  if (in_EDI == 4) {
    local_14 = 1;
  }
  else {
    if (in_EDI != 5) {
      printTestUsage();
      exit(1);
    }
    local_14 = atoi(*(char **)(in_RSI + 0x20));
  }
  ::fasttext::FastText::FastText(in_stack_fffffffffffffcf0);
  pcVar1 = *(char **)(local_10 + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,pcVar1,&local_99);
  ::fasttext::FastText::loadModel(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  pcVar1 = *(char **)(local_10 + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,pcVar1,&local_d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  if (bVar2) {
    ::fasttext::FastText::test
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
  }
  else {
    std::ifstream::ifstream(local_2e0,local_d0,_S_in);
    bVar3 = std::ifstream::is_open();
    if ((bVar3 & 1) == 0) {
      this = std::operator<<((ostream *)&std::cerr,"Test file cannot be opened!");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    ::fasttext::FastText::test
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
    std::ifstream::close();
    std::ifstream::~ifstream(local_2e0);
  }
  exit(0);
}

Assistant:

void test(int argc, char** argv) {
  int32_t k;
  if (argc == 4) {
    k = 1;
  } else if (argc == 5) {
    k = atoi(argv[4]);
  } else {
    printTestUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(argv[2]));
  std::string infile(argv[3]);
  if (infile == "-") {
    fasttext.test(std::cin, k);
  } else {
    std::ifstream ifs(infile);
    if (!ifs.is_open()) {
      std::cerr << "Test file cannot be opened!" << std::endl;
      exit(EXIT_FAILURE);
    }
    fasttext.test(ifs, k);
    ifs.close();
  }
  exit(0);
}